

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_dispatcher.cpp
# Opt level: O1

bool __thiscall
cppcms::anon_unknown_0::mounted::dispatch
          (mounted *this,string *url,char *method,application *param_3)

{
  pointer ppVar1;
  application *paVar2;
  bool bVar3;
  bool bVar4;
  long lVar5;
  char *pcVar6;
  char *pcVar7;
  undefined1 *local_38;
  undefined8 local_30;
  undefined1 local_28 [16];
  
  bVar4 = option::matches(&this->super_option,url,method);
  if (bVar4) {
    lVar5 = (long)this->select_;
    if (((lVar5 < 0) ||
        (ppVar1 = (this->super_option).match_.offsets_.
                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                  _M_impl.super__Vector_impl_data._M_start,
        (int)((ulong)((long)(this->super_option).match_.offsets_.
                            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar1) >> 3) <=
        this->select_)) || ((long)ppVar1[lVar5].first == -1)) {
      pcVar6 = (char *)0x0;
      pcVar7 = (char *)0x0;
      bVar3 = false;
    }
    else {
      pcVar6 = (this->super_option).match_.begin_;
      pcVar7 = pcVar6 + ppVar1[lVar5].first;
      pcVar6 = pcVar6 + ppVar1[lVar5].second;
      bVar3 = true;
    }
    paVar2 = this->app_;
    local_38 = local_28;
    if (bVar3) {
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,pcVar7,pcVar6);
    }
    else {
      local_30 = 0;
      local_28[0] = 0;
    }
    (*paVar2->_vptr_application[2])(paVar2,&local_38);
    if (local_38 != local_28) {
      operator_delete(local_38);
    }
  }
  return bVar4;
}

Assistant:

virtual bool dispatch(std::string const &url,char const *method,application *)
			{
				if(matches(url,method)) {
					app_->main(match_[select_]);
					return true;
				}
				return false;
			}